

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

void run_collapse_init_task(parallel_task_1d *task,size_t thread_id)

{
  uint uVar1;
  ulong uVar2;
  work_fn_t p_Var3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (task->range).begin;
  uVar2 = (task->range).end;
  if (uVar5 < uVar2) {
    lVar6 = uVar5 << 5;
    do {
      p_Var3 = task[1].work_item.work_fn;
      (&(task[1].work_item.next)->work_fn)[uVar5] = (work_fn_t)0x1;
      *(undefined4 *)(task[1].range.end + uVar5 * 4) = 0;
      if (*(int *)(p_Var3 + lVar6 + 0x18) == 0) {
        sVar4 = task[1].range.begin;
        uVar1 = *(uint *)(p_Var3 + lVar6 + 0x1c);
        *(ulong *)(sVar4 + (ulong)uVar1 * 8) = uVar5;
        *(ulong *)(sVar4 + (ulong)(uVar1 + 1) * 8) = uVar5;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar2 != uVar5);
  }
  return;
}

Assistant:

static void run_collapse_init_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct collapse_init_task* collapse_init_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct bvh_node* node = &collapse_init_task->nodes[i];
        collapse_init_task->node_counts[i] = 1;
        atomic_init(&collapse_init_task->flags[i], 0);
        if (node->primitive_count == 0) {
            collapse_init_task->parents[node->first_child_or_primitive + 0] = i;
            collapse_init_task->parents[node->first_child_or_primitive + 1] = i;
        }
    }
}